

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

char * CVmObjString::alloc_str_buf(vm_val_t *new_obj,char *buf,size_t buf_size,size_t required_size)

{
  vm_obj_id_t obj;
  CVmObject *pCVar1;
  ulong in_RCX;
  ulong in_RDX;
  char *in_RSI;
  vm_val_t *in_RDI;
  size_t in_stack_ffffffffffffffc8;
  char *local_8;
  
  if ((in_RSI == (char *)0x0) || (in_RDX < in_RCX)) {
    obj = create((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffc8);
    vm_val_t::set_obj(in_RDI,obj);
    pCVar1 = vm_objp(0);
    local_8 = pCVar1->ext_;
  }
  else {
    vm_val_t::set_nil(in_RDI);
    local_8 = in_RSI;
  }
  return local_8;
}

Assistant:

char *CVmObjString::alloc_str_buf(VMG_ vm_val_t *new_obj,
                                  char *buf, size_t buf_size,
                                  size_t required_size)
{
    /* if the provided buffer is large enough, use it */
    if (buf != 0 && buf_size >= required_size)
    {
        /* there's no new object */
        new_obj->set_nil();
        
        /* return the buffer */
        return buf;
    }

    /* allocate a new string object */
    new_obj->set_obj(CVmObjString::create(vmg_ FALSE, required_size));

    /* return the new object's full string buffer from the length prefix */
    return ((CVmObjString *)vm_objp(vmg_ new_obj->val.obj))->ext_;
}